

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::List<TTD::TTDPendingAsyncBufferModification,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
               (AllocatorType *allocator,
               List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *obj)

{
  size_t sVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *obj_local;
  AllocatorType *allocator_local;
  
  (*(obj->
    super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
    )._vptr_ReadOnlyList[2])();
  local_40 = (code *)TypeAllocatorFunc<Memory::HeapAllocator,_JsUtil::List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     ::GetFreeFunc();
  plVar2 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *plVar2 + -1);
  }
  sVar1 = _AllocatorDelete<JsUtil::List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_(Memory::AllocatorDeleteFlags)0>
          ::Size();
  (*local_40)(plVar2,obj,sVar1);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}